

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

LArYieldResult * __thiscall
NEST::LArNEST::GetNRYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double efield,
          double density)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar7 = (this->fNR).alpha;
  dVar1 = pow(energy,(this->fNR).beta);
  dVar6 = (this->fNR).gamma;
  dVar2 = pow(efield,(this->fNR).delta);
  dVar3 = (this->fNR).epsilon + energy;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar7 = dVar7 * dVar1;
  dVar1 = pow(energy / (this->fNR).zeta,(this->fNR).eta);
  dVar1 = (1.0 - 1.0 / (dVar1 + 1.0)) * (1.0 / (dVar2 * dVar6)) * (1.0 / dVar3);
  dVar6 = 0.0;
  if (0.0 <= dVar1) {
    dVar6 = dVar1;
  }
  dVar1 = (this->fNR).alpha;
  dVar3 = pow(energy,(this->fNR).beta);
  dVar2 = (this->fNR).gamma;
  dVar4 = pow(efield,(this->fNR).delta);
  dVar5 = (this->fNR).epsilon + energy;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar2 = dVar1 * dVar3 + (-1.0 / (dVar4 * dVar2)) * (1.0 / dVar5);
  dVar1 = 0.0;
  if (0.0 <= dVar2) {
    dVar1 = dVar2;
  }
  dVar2 = this->fNexOverNion;
  dVar3 = this->fWorkQuantaFunction;
  __return_storage_ptr__->TotalYield = dVar7;
  __return_storage_ptr__->QuantaYield = dVar6;
  __return_storage_ptr__->LightYield = dVar1;
  __return_storage_ptr__->Nph = dVar1 * energy;
  __return_storage_ptr__->Ne = dVar6 * energy;
  dVar1 = dVar6 * energy + dVar1 * energy;
  dVar6 = dVar1 / (dVar2 + 1.0);
  __return_storage_ptr__->Nex = dVar1 - dVar6;
  __return_storage_ptr__->Nion = dVar6;
  __return_storage_ptr__->Lindhard = (dVar7 / energy) * dVar3 * 0.001;
  __return_storage_ptr__->ElectricField = efield;
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetNRYields(double energy, double efield,
                                    double density) {
  double NRTotalYields = GetNRTotalYields(energy);
  double NRElectronYields = GetNRElectronYields(energy, efield);
  if (NRElectronYields < 0.0) {
    NRElectronYields = 0.0;
  }
  double NRPhotonYields = GetNRPhotonYields(energy, efield);
  if (NRPhotonYields < 0.0) {
    NRPhotonYields = 0.0;
  }
  return GetRecombinationYields(NRTotalYields, NRElectronYields, NRPhotonYields,
                                energy, efield);
}